

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btStaticPlaneShape.cpp
# Opt level: O2

void __thiscall
btStaticPlaneShape::btStaticPlaneShape
          (btStaticPlaneShape *this,btVector3 *planeNormal,btScalar planeConstant)

{
  btVector3 bVar1;
  
  btConcaveShape::btConcaveShape(&this->super_btConcaveShape);
  (this->super_btConcaveShape).super_btCollisionShape._vptr_btCollisionShape =
       (_func_int **)&PTR__btStaticPlaneShape_001efa10;
  bVar1 = btVector3::normalized(planeNormal);
  *&(this->m_planeNormal).m_floats = bVar1.m_floats;
  this->m_planeConstant = planeConstant;
  (this->m_localScaling).m_floats[0] = 1.0;
  (this->m_localScaling).m_floats[1] = 1.0;
  (this->m_localScaling).m_floats[2] = 1.0;
  (this->m_localScaling).m_floats[3] = 0.0;
  (this->super_btConcaveShape).super_btCollisionShape.m_shapeType = 0x1c;
  return;
}

Assistant:

btStaticPlaneShape::btStaticPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
: btConcaveShape (), m_planeNormal(planeNormal.normalized()),
m_planeConstant(planeConstant),
m_localScaling(btScalar(1.),btScalar(1.),btScalar(1.))
{
	m_shapeType = STATIC_PLANE_PROXYTYPE;
	//	btAssert( btFuzzyZero(m_planeNormal.length() - btScalar(1.)) );
}